

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_interpolation_with_magic_number.cc
# Opt level: O0

void __thiscall
sptk::InputSourceInterpolationWithMagicNumber::InputSourceInterpolationWithMagicNumber
          (InputSourceInterpolationWithMagicNumber *this,int frame_period,int interpolation_period,
          bool use_final_frame_for_exceeded_frame,double magic_number,InputSourceInterface *source)

{
  uint uVar1;
  size_type sVar2;
  byte in_CL;
  int in_EDX;
  int in_ESI;
  InputSourceInterpolationWithMagicNumber *in_RDI;
  InputSourceInterface *in_R8;
  double in_XMM0_Qa;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff68;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  
  InputSourceInterface::InputSourceInterface(&in_RDI->super_InputSourceInterface);
  (in_RDI->super_InputSourceInterface)._vptr_InputSourceInterface =
       (_func_int **)&PTR__InputSourceInterpolationWithMagicNumber_00128ca8;
  in_RDI->frame_period_ = in_ESI;
  in_RDI->interpolation_period_ = in_EDX;
  in_RDI->first_interpolation_period_ = in_RDI->interpolation_period_ / 2;
  in_RDI->use_final_frame_for_exceeded_frame_ = (bool)(in_CL & 1);
  in_RDI->magic_number_ = in_XMM0_Qa;
  in_RDI->remained_num_samples_ = 0;
  in_RDI->data_length_ = 0;
  in_RDI->point_index_in_frame_ = 0;
  in_RDI->source_ = in_R8;
  in_RDI->is_valid_ = true;
  __result._M_current = (double *)&in_RDI->curr_data_;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x106f71);
  __last._M_current = (double *)&in_RDI->next_data_;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x106f84);
  __first._M_current = (double *)&in_RDI->increment_;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x106f97);
  if ((((in_RDI->frame_period_ < 1) || (in_RDI->interpolation_period_ < 0)) ||
      (in_RDI->frame_period_ / 2 < in_RDI->interpolation_period_)) ||
     ((in_RDI->source_ == (InputSourceInterface *)0x0 ||
      (uVar1 = (*in_RDI->source_->_vptr_InputSourceInterface[3])
                         (in_RDI->source_,2,(long)in_RDI->frame_period_ % 2 & 0xffffffff),
      (uVar1 & 1) == 0)))) {
    in_RDI->is_valid_ = false;
  }
  else {
    uVar1 = (*in_RDI->source_->_vptr_InputSourceInterface[4])(in_RDI->source_,&in_RDI->curr_data_);
    if ((uVar1 & 1) == 0) {
      in_RDI->remained_num_samples_ = 0;
    }
    else {
      in_RDI->remained_num_samples_ = in_RDI->frame_period_ + 1;
      sVar2 = std::vector<double,_std::allocator<double>_>::size(&in_RDI->curr_data_);
      in_RDI->data_length_ = (int)sVar2;
      uVar1 = (*in_RDI->source_->_vptr_InputSourceInterface[4])(in_RDI->source_,&in_RDI->next_data_)
      ;
      if ((uVar1 & 1) == 0) {
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)__last._M_current,
                   (size_type)__result._M_current);
        std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff68);
        std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff68);
        std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff68);
        std::
        copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                  (__first,__last,__result);
        in_RDI->remained_num_samples_ = 1;
      }
      if (0 < in_RDI->interpolation_period_) {
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)__last._M_current,
                   (size_type)__result._M_current);
        CalculateIncrement(in_RDI);
      }
    }
  }
  return;
}

Assistant:

InputSourceInterpolationWithMagicNumber::
    InputSourceInterpolationWithMagicNumber(
        int frame_period, int interpolation_period,
        bool use_final_frame_for_exceeded_frame, double magic_number,
        InputSourceInterface* source)
    : frame_period_(frame_period),
      interpolation_period_(interpolation_period),
      first_interpolation_period_(interpolation_period_ / 2),
      use_final_frame_for_exceeded_frame_(use_final_frame_for_exceeded_frame),
      magic_number_(magic_number),
      remained_num_samples_(0),
      data_length_(0),
      point_index_in_frame_(0),
      source_(source),
      is_valid_(true) {
  if (frame_period_ <= 0 || interpolation_period_ < 0 ||
      frame_period_ / 2 < interpolation_period_ || NULL == source_ ||
      !source_->IsValid()) {
    is_valid_ = false;
    return;
  }

  if (!source_->Get(&curr_data_)) {
    remained_num_samples_ = 0;
    return;
  }

  remained_num_samples_ = frame_period_ + 1;
  data_length_ = static_cast<int>(curr_data_.size());

  if (!source_->Get(&next_data_)) {
    next_data_.resize(data_length_);
    std::copy(curr_data_.begin(), curr_data_.end(), next_data_.begin());
    remained_num_samples_ = 1;
  }

  if (0 < interpolation_period_) {
    increment_.resize(data_length_);
    CalculateIncrement();
  }
}